

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>>::
operator()(AssertionResult *__return_storage_ptr__,
          EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>> *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string sStack_58;
  AssertionResult local_38;
  
  bVar1 = Each<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
                    (this,(actual->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<std::pair<const_int,_int>_>)
                     &(actual->_M_t)._M_impl.super__Rb_tree_header);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    WhichIs_abi_cxx11_(&sStack_58,this);
    rhs = AssertionResult::operator<<(&local_38,&sStack_58);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }